

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InlineCache.h
# Opt level: O3

void Js::InlineCache::OutputPropertyValue<false,_true,_(Js::CacheType)2,_(Js::SlotType)1>::impl
               (InlineCache *cache,Var instance,RecyclableObject *propertyObject,
               PropertyId propertyId,Var *propertyValue,ScriptContext *requestContext)

{
  Type *pTVar1;
  code *pcVar2;
  bool bVar3;
  Var pvVar4;
  RecyclableObject *pRVar5;
  RecyclableObject *pRVar6;
  undefined4 *puVar7;
  
  pvVar4 = DynamicObject::GetInlineSlot
                     ((cache->u).proto.prototypeObject,(uint)(cache->u).proto.slotIndex);
  *propertyValue = pvVar4;
  pRVar6 = (RecyclableObject *)0x0;
  pRVar5 = (RecyclableObject *)
           JavascriptOperators::GetProperty
                     (propertyObject,propertyObject,propertyId,requestContext,
                      (PropertyValueInfo *)0x0);
  if ((((propertyObject->type).ptr)->typeId & ~TypeIds_Null) == TypeIds_GlobalObject) {
    pRVar6 = (RecyclableObject *)
             JavascriptOperators::GetRootProperty
                       (propertyObject,propertyId,requestContext,(PropertyValueInfo *)0x0);
  }
  if (((RecyclableObject *)*propertyValue != pRVar5) &&
     ((pTVar1 = (propertyObject->type).ptr, (RecyclableObject *)*propertyValue != pRVar6 ||
      ((pTVar1->typeId & ~TypeIds_Null) != TypeIds_GlobalObject)))) {
    if ((pRVar5 == (((requestContext->super_ScriptContextBase).javascriptLibrary)->
                   super_JavascriptLibraryBase).nullValue.ptr) &&
       (((requestContext->threadContext->disableImplicitFlags & DisableImplicitCallFlag) !=
         DisableImplicitNoFlag &&
        ((pTVar1->flags & TypeFlagMask_EngineExternal) != TypeFlagMask_None)))) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar7 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Types/Type.h"
                                  ,0x49,"((this->flags & TypeFlagMask_EngineExternal) == 0)",
                                  "Not expected.");
      if (!bVar3) goto LAB_00ae4ec9;
      *puVar7 = 0;
    }
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar7 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/InlineCache.h"
                                ,0x1d7,
                                "(*propertyValue == slowPathValue || (VarIs<RootObjectBase>(propertyObject) && *propertyValue == rootObjectValue) || (slowPathValue == requestContext->GetLibrary()->GetNull() && requestContext->GetThreadContext()->IsDisableImplicitCall() && propertyObject->GetType()->IsExternal()))"
                                ,
                                "*propertyValue == slowPathValue || (VarIs<RootObjectBase>(propertyObject) && *propertyValue == rootObjectValue) || (slowPathValue == requestContext->GetLibrary()->GetNull() && requestContext->GetThreadContext()->IsDisableImplicitCall() && propertyObject->GetType()->IsExternal())"
                               );
    if (!bVar3) {
LAB_00ae4ec9:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar7 = 0;
  }
  return;
}

Assistant:

static void impl(
                InlineCache* cache,
                Var const instance,
                RecyclableObject *const propertyObject,
                const PropertyId propertyId,
                Var *const propertyValue,
                ScriptContext *const requestContext)
            {
                *propertyValue = InlineCache::GetPropertyValue<slotType>(cache->GetSourceObject<cacheType>(propertyObject), cache->GetSlotIndex<cacheType>());
#if DBG
                Var slowPathValue = JavascriptOperators::GetProperty(propertyObject, propertyId, requestContext);
                Var rootObjectValue = nullptr;
                if (VarIs<RootObjectBase>(propertyObject))
                {
                    rootObjectValue = JavascriptOperators::GetRootProperty(propertyObject, propertyId, requestContext);
                }
                Assert(*propertyValue == slowPathValue ||
                    (VarIs<RootObjectBase>(propertyObject) && *propertyValue == rootObjectValue) ||
                    // In some cases, such as CustomExternalObject, if implicit calls are disabled GetPropertyQuery may return null. See CustomExternalObject::GetPropertyQuery for an example.
                    (slowPathValue == requestContext->GetLibrary()->GetNull() && requestContext->GetThreadContext()->IsDisableImplicitCall() && propertyObject->GetType()->IsExternal()));
#endif
            }